

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cpp
# Opt level: O0

fdPtr __thiscall Liby::FileDescriptor::openFile(FileDescriptor *this,string *filepath)

{
  int iVar1;
  ulong uVar2;
  char *__file;
  Logger *this_00;
  int *piVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  double __x;
  shared_ptr<Liby::FileDescriptor> sVar5;
  fdPtr fVar6;
  int fd;
  string *filepath_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __file = (char *)std::__cxx11::string::data();
    iVar1 = open(__file,2);
    if (-1 < iVar1) {
      sVar5 = std::make_shared<Liby::FileDescriptor,int&>(&this->fd_);
      _Var4 = sVar5.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      goto LAB_00112de3;
    }
    this_00 = Logger::getLogger();
    std::__cxx11::string::data();
    piVar3 = __errno_location();
    strerror(*piVar3);
    Logger::log(this_00,__x);
  }
  std::shared_ptr<Liby::FileDescriptor>::shared_ptr
            ((shared_ptr<Liby::FileDescriptor> *)this,(nullptr_t)0x0);
  _Var4._M_pi = extraout_RDX;
LAB_00112de3:
  fVar6.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  fVar6.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (fdPtr)fVar6.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

fdPtr Liby::FileDescriptor::openFile(const std::string &filepath) {
    int fd;
    if (!filepath.empty()) {
        if ((fd = ::open(filepath.data(), O_RDWR)) >= 0) {
            return std::make_shared<FileDescriptor>(fd);
        } else {
            error("open %s error: %s", filepath.data(), ::strerror(errno));
        }
    }
    return nullptr;
}